

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O0

void sample_output<trng::lagfib2plus<unsigned_long,9842u,19937u>>
               (lagfib2plus<unsigned_long,_9842U,_19937U> *r,string *name)

{
  ulong uVar1;
  result_type rVar2;
  ostream *poVar3;
  string *in_RSI;
  int i;
  int local_14;
  
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (0x1f < uVar1) break;
    std::__cxx11::string::operator+=(in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,in_RSI);
  for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
    rVar2 = trng::lagfib2plus<unsigned_long,_9842U,_19937U>::operator()
                      ((lagfib2plus<unsigned_long,_9842U,_19937U> *)in_RSI);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
    std::operator<<(poVar3,'\t');
  }
  rVar2 = trng::lagfib2plus<unsigned_long,_9842U,_19937U>::operator()
                    ((lagfib2plus<unsigned_long,_9842U,_19937U> *)in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}